

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::RWLocker::LockForWriting(RWLocker *this)

{
  Mutex *in_RDI;
  
  if (((in_RDI->mutex_).__size[8] & 1U) == 0) {
    Mutex::ReaderUnlock(in_RDI);
    Mutex::WriterLock((Mutex *)0x2431a3);
    (in_RDI->mutex_).__size[8] = '\x01';
  }
  return;
}

Assistant:

void DFA::RWLocker::LockForWriting() NO_THREAD_SAFETY_ANALYSIS {
  if (!writing_) {
    mu_->ReaderUnlock();
    mu_->WriterLock();
    writing_ = true;
  }
}